

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

int trytypetag(rnndb *db,char *file,xmlNode *node,rnntypeinfo *ti)

{
  int iVar1;
  xmlChar *__s1;
  int iVar2;
  rnnbitfield *prVar3;
  rnnbitfield **pprVar4;
  int *piVar5;
  
  __s1 = node->name;
  iVar2 = strcmp((char *)__s1,"value");
  if (iVar2 == 0) {
    prVar3 = (rnnbitfield *)parsevalue(db,file,node);
    if (prVar3 == (rnnbitfield *)0x0) {
      return 1;
    }
    piVar5 = &ti->valsnum;
    iVar2 = ti->valsnum;
    iVar1 = ti->valsmax;
    if (iVar2 < iVar1) {
      pprVar4 = (rnnbitfield **)ti->vals;
    }
    else {
      iVar2 = 0x10;
      if (iVar1 != 0) {
        iVar2 = iVar1 * 2;
      }
      ti->valsmax = iVar2;
      pprVar4 = (rnnbitfield **)realloc(ti->vals,(long)iVar2 << 3);
      ti->vals = (rnnvalue **)pprVar4;
      iVar2 = ti->valsnum;
    }
  }
  else {
    iVar2 = strcmp((char *)__s1,"bitfield");
    if (iVar2 != 0) {
      return 0;
    }
    prVar3 = parsebitfield(db,file,node);
    if (prVar3 == (rnnbitfield *)0x0) {
      return 1;
    }
    piVar5 = &ti->bitfieldsnum;
    iVar2 = ti->bitfieldsnum;
    iVar1 = ti->bitfieldsmax;
    if (iVar2 < iVar1) {
      pprVar4 = ti->bitfields;
    }
    else {
      iVar2 = 0x10;
      if (iVar1 != 0) {
        iVar2 = iVar1 * 2;
      }
      ti->bitfieldsmax = iVar2;
      pprVar4 = (rnnbitfield **)realloc(ti->bitfields,(long)iVar2 << 3);
      ti->bitfields = pprVar4;
      iVar2 = ti->bitfieldsnum;
    }
  }
  *piVar5 = iVar2 + 1;
  pprVar4[iVar2] = prVar3;
  return 1;
}

Assistant:

static int trytypetag (struct rnndb *db, char *file, xmlNode *node, struct rnntypeinfo *ti) {
	if (!strcmp(node->name, "value")) {
		struct rnnvalue *val = parsevalue(db, file, node);
		if (val)
			ADDARRAY(ti->vals, val);
		return 1;
	} else if (!strcmp(node->name, "bitfield")) {
		struct rnnbitfield *bf = parsebitfield(db, file, node);
		if (bf)
			ADDARRAY(ti->bitfields, bf);
		return 1;
	}
	return 0;
}